

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontSym.cpp
# Opt level: O0

void __thiscall TPZFrontSym<float>::PrintGlobal(TPZFrontSym<float> *this,char *name,ostream *out)

{
  ostream *poVar1;
  int64_t iVar2;
  long *plVar3;
  int64_t iVar4;
  float *pfVar5;
  ostream *in_RDX;
  char *in_RSI;
  long in_RDI;
  int64_t j;
  int64_t i;
  TPZFrontSym<float> *this_00;
  int64_t local_28;
  TPZFrontSym<float> *local_20;
  
  poVar1 = std::operator<<(in_RDX,in_RSI);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  for (local_20 = (TPZFrontSym<float> *)0x0;
      iVar2 = TPZVec<long>::NElements((TPZVec<long> *)(in_RDI + 0x80)), (long)local_20 < iVar2;
      local_20 = (TPZFrontSym<float> *)((long)local_20 + 1)) {
    plVar3 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x80),(int64_t)local_20);
    if (*plVar3 != -1) {
      poVar1 = (ostream *)std::ostream::operator<<(in_RDX,(long)local_20);
      std::operator<<(poVar1," ");
    }
  }
  std::ostream::operator<<(in_RDX,std::endl<char,std::char_traits<char>>);
  local_20 = (TPZFrontSym<float> *)0x0;
  while (this_00 = local_20, iVar2 = TPZVec<long>::NElements((TPZVec<long> *)(in_RDI + 0x80)),
        (long)this_00 < iVar2) {
    plVar3 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x80),(int64_t)local_20);
    if (*plVar3 != -1) {
      local_28 = 0;
      while (iVar2 = local_28, iVar4 = TPZVec<long>::NElements((TPZVec<long> *)(in_RDI + 0x80)),
            iVar2 < iVar4) {
        plVar3 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x80),local_28);
        if (*plVar3 != -1) {
          poVar1 = in_RDX;
          TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x80),(int64_t)local_20);
          TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x80),local_28);
          pfVar5 = Element(this_00,iVar2,(int64_t)poVar1);
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pfVar5);
          std::operator<<(poVar1," ");
        }
        local_28 = local_28 + 1;
      }
      std::ostream::operator<<(in_RDX,std::endl<char,std::char_traits<char>>);
    }
    local_20 = (TPZFrontSym<float> *)
               ((long)&(local_20->super_TPZFront<float>).super_TPZSavable._vptr_TPZSavable + 1);
  }
  std::ostream::operator<<(in_RDX,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void TPZFrontSym<TVar>::PrintGlobal(const char *name, std::ostream& out){
	int64_t i, j;
	out << name << endl;
	for(i=0;i<this->fLocal.NElements();i++){
		if(this->fLocal[i]!=-1) out << i << " ";
	}
	out << endl;
	for(i=0;i<this->fLocal.NElements();i++){
		if(this->fLocal[i]==-1) continue;
		for(j=0;j<this->fLocal.NElements();j++){
			if(this->fLocal[j]==-1) continue;
			out << Element(this->fLocal[i],this->fLocal[j]) << " ";
		}
		out << endl;
	}
	out << endl;
}